

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O3

Matrix<double,_3,_3> * __thiscall
gl4cts::Math::outerProduct<3,3>
          (Matrix<double,_3,_3> *__return_storage_ptr__,Math *this,Vector<double,_3> *left,
          Vector<double,_3> *right)

{
  Vector<double,_3> *pVVar1;
  undefined1 auVar2 [16];
  int row_1;
  long lVar3;
  double *pdVar4;
  long lVar5;
  long lVar6;
  undefined1 *puVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  bool bVar10;
  undefined1 auVar11 [16];
  double dVar13;
  undefined8 uVar14;
  Matrix<double,_1,_3> local_98;
  Matrix<double,_3,_1> local_78;
  undefined1 local_60 [72];
  long lVar12;
  
  auVar2 = _DAT_019ec5b0;
  lVar3 = 0;
  auVar8 = _DAT_019f34d0;
  do {
    bVar10 = SUB164(auVar8 ^ _DAT_019ec5b0,4) == -0x80000000 &&
             SUB164(auVar8 ^ _DAT_019ec5b0,0) < -0x7ffffffd;
    if (bVar10) {
      dVar13 = 1.0;
      if (lVar3 != 0) {
        dVar13 = 0.0;
      }
      local_78.m_data.m_data[0].m_data[lVar3] = dVar13;
    }
    if (bVar10) {
      local_78.m_data.m_data[0].m_data[lVar3 + 1] = 0.0;
    }
    lVar3 = lVar3 + 2;
    lVar5 = auVar8._8_8_;
    auVar8._0_8_ = auVar8._0_8_ + 2;
    auVar8._8_8_ = lVar5 + 2;
  } while (lVar3 != 4);
  lVar3 = 0;
  auVar9 = _DAT_019f34d0;
  do {
    bVar10 = SUB164(auVar9 ^ _DAT_019ec5b0,4) == -0x80000000 &&
             SUB164(auVar9 ^ _DAT_019ec5b0,0) < -0x7ffffffd;
    if (bVar10) {
      dVar13 = 1.0;
      if (lVar3 != 0) {
        dVar13 = 0.0;
      }
      local_98.m_data.m_data[lVar3].m_data[0] = dVar13;
    }
    if (bVar10) {
      local_98.m_data.m_data[lVar3 + 1].m_data[0] = 0.0;
    }
    lVar3 = lVar3 + 2;
    lVar5 = auVar9._8_8_;
    auVar9._0_8_ = auVar9._0_8_ + 2;
    auVar9._8_8_ = lVar5 + 2;
  } while (lVar3 != 4);
  (__return_storage_ptr__->m_data).m_data[2].m_data[0] = 0.0;
  (__return_storage_ptr__->m_data).m_data[2].m_data[1] = 0.0;
  pVVar1 = (__return_storage_ptr__->m_data).m_data;
  pVVar1[1].m_data[1] = 0.0;
  pVVar1[1].m_data[2] = 0.0;
  *(undefined1 (*) [16])((__return_storage_ptr__->m_data).m_data[0].m_data + 2) =
       (undefined1  [16])0x0;
  (__return_storage_ptr__->m_data).m_data[0].m_data[0] = 0.0;
  (__return_storage_ptr__->m_data).m_data[0].m_data[1] = 0.0;
  (__return_storage_ptr__->m_data).m_data[2].m_data[2] = 0.0;
  auVar8 = _DAT_019f34d0;
  lVar3 = 0;
  lVar5 = 0;
  pdVar4 = (double *)__return_storage_ptr__;
  do {
    lVar6 = 0;
    auVar11 = auVar8;
    do {
      bVar10 = SUB164(auVar11 ^ auVar2,4) == -0x80000000 && SUB164(auVar11 ^ auVar2,0) < -0x7ffffffd
      ;
      if (bVar10) {
        uVar14 = 0x3ff0000000000000;
        if (lVar3 != lVar6) {
          uVar14 = 0;
        }
        *(undefined8 *)((long)pdVar4 + lVar6) = uVar14;
      }
      if (bVar10) {
        uVar14 = 0x3ff0000000000000;
        if (lVar3 + -0x18 != lVar6) {
          uVar14 = 0;
        }
        *(undefined8 *)((long)pdVar4 + lVar6 + 0x18) = uVar14;
      }
      lVar12 = auVar11._8_8_;
      auVar11._0_8_ = auVar11._0_8_ + 2;
      auVar11._8_8_ = lVar12 + 2;
      lVar6 = lVar6 + 0x30;
    } while (lVar6 != 0x60);
    lVar5 = lVar5 + 1;
    lVar3 = lVar3 + 0x18;
    pdVar4 = pdVar4 + 1;
  } while (lVar5 != 3);
  local_78.m_data.m_data[0].m_data[2] = *(double *)(this + 0x10);
  local_78.m_data.m_data[0].m_data[0] = *(double *)this;
  local_78.m_data.m_data[0].m_data[1] = *(double *)(this + 8);
  local_98.m_data.m_data[0].m_data[0] = (double  [1])left->m_data[0];
  local_98.m_data.m_data[1].m_data[0] = (double  [1])left->m_data[1];
  local_98.m_data.m_data[2].m_data[0] = (double  [1])left->m_data[2];
  puVar7 = local_60;
  tcu::operator*(&local_78,&local_98);
  lVar3 = 0;
  pdVar4 = (double *)__return_storage_ptr__;
  do {
    lVar5 = 0;
    do {
      *(undefined8 *)((long)pdVar4 + lVar5) = *(undefined8 *)(puVar7 + lVar5);
      lVar5 = lVar5 + 0x18;
    } while (lVar5 != 0x48);
    lVar3 = lVar3 + 1;
    pdVar4 = pdVar4 + 1;
    puVar7 = puVar7 + 8;
  } while (lVar3 != 3);
  return __return_storage_ptr__;
}

Assistant:

static tcu::Matrix<glw::GLdouble, Rows, Cols> outerProduct(const tcu::Vector<glw::GLdouble, Rows>& left,
														   const tcu::Vector<glw::GLdouble, Cols>& right)
{
	tcu::Matrix<glw::GLdouble, Rows, 1>	left_mat;
	tcu::Matrix<glw::GLdouble, 1, Cols>	right_mat;
	tcu::Matrix<glw::GLdouble, Rows, Cols> result;

	for (glw::GLuint i = 0; i < Rows; ++i)
	{
		left_mat(i, 0) = left[i];
	}

	for (glw::GLuint i = 0; i < Cols; ++i)
	{
		right_mat(0, i) = right[i];
	}

	result = left_mat * right_mat;

	return result;
}